

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::passModel(Highs *this,HighsInt num_col,HighsInt num_row,HighsInt a_num_nz,HighsInt q_num_nz,
                HighsInt a_format,HighsInt q_format,HighsInt sense,double offset,double *costs,
                double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                HighsInt *a_start,HighsInt *a_index,double *a_value,HighsInt *q_start,
                HighsInt *q_index,double *q_value,HighsInt *integrality)

{
  uint uVar1;
  bool bVar2;
  undefined1 uVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar6;
  pointer in_XMM0_Qa;
  int in_stack_00000010;
  long in_stack_00000070;
  HighsHessian *hessian;
  bool legal_integrality_status;
  HighsInt integrality_status;
  HighsInt iCol;
  bool a_rowwise;
  HighsLp *lp;
  HighsModel model;
  HighsStatus in_stack_fffffffffffff7a0;
  value_type in_stack_fffffffffffff7a4;
  undefined2 in_stack_fffffffffffff7a8;
  value_type in_stack_fffffffffffff7aa;
  undefined1 in_stack_fffffffffffff7ab;
  value_type in_stack_fffffffffffff7ac;
  value_type in_stack_fffffffffffff7b0;
  undefined2 in_stack_fffffffffffff7b4;
  undefined1 in_stack_fffffffffffff7b6;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffff7b7;
  Highs *this_00;
  Highs *__new_size;
  HighsModel *in_stack_fffffffffffffa90;
  Highs *in_stack_fffffffffffffa98;
  uint local_438;
  pointer local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  HighsStatus local_4;
  
  local_30 = in_XMM0_Qa;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  logHeader((Highs *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
  this_00 = (Highs *)&stack0xfffffffffffffbe8;
  HighsModel::HighsModel
            ((HighsModel *)
             CONCAT17(in_stack_fffffffffffff7b7,
                      CONCAT16(in_stack_fffffffffffff7b6,
                               CONCAT24(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0))));
  __new_size = this_00;
  bVar2 = aFormatOk(this_00,CONCAT13(in_stack_fffffffffffff7b7,
                                     CONCAT12(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b4)),
                    in_stack_fffffffffffff7b0);
  if (bVar2) {
    uVar3 = qFormatOk((Highs *)CONCAT44(in_stack_fffffffffffff7ac,
                                        CONCAT13(in_stack_fffffffffffff7ab,
                                                 CONCAT12(in_stack_fffffffffffff7aa,
                                                          in_stack_fffffffffffff7a8))),
                      in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0);
    if ((bool)uVar3) {
      bVar2 = 0 < local_1c;
      bVar6 = local_24 == 2;
      uVar7 = bVar2 && bVar6;
      *(int *)&this_00->_vptr_Highs = local_14;
      *(int *)((long)&this_00->_vptr_Highs + 4) = local_18;
      if (0 < local_14) {
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff7ac,
                            CONCAT13(in_stack_fffffffffffff7ab,
                                     CONCAT12(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a8)))
                   ,(double *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff7ac,
                            CONCAT13(in_stack_fffffffffffff7ab,
                                     CONCAT12(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a8)))
                   ,(double *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff7ac,
                            CONCAT13(in_stack_fffffffffffff7ab,
                                     CONCAT12(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a8)))
                   ,(double *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
      }
      if (0 < local_18) {
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff7ac,
                            CONCAT13(in_stack_fffffffffffff7ab,
                                     CONCAT12(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a8)))
                   ,(double *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff7ac,
                            CONCAT13(in_stack_fffffffffffff7ab,
                                     CONCAT12(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a8)))
                   ,(double *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
      }
      if (0 < local_1c) {
        if (bVar2 && bVar6) {
          std::vector<int,std::allocator<int>>::assign<int_const*,void>
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                            in_stack_fffffffffffff7b0))),
                     (int *)CONCAT44(in_stack_fffffffffffff7ac,
                                     CONCAT13(in_stack_fffffffffffff7ab,
                                              CONCAT12(in_stack_fffffffffffff7aa,
                                                       in_stack_fffffffffffff7a8))),
                     (int *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        }
        else {
          std::vector<int,std::allocator<int>>::assign<int_const*,void>
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                            in_stack_fffffffffffff7b0))),
                     (int *)CONCAT44(in_stack_fffffffffffff7ac,
                                     CONCAT13(in_stack_fffffffffffff7ab,
                                              CONCAT12(in_stack_fffffffffffff7aa,
                                                       in_stack_fffffffffffff7a8))),
                     (int *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        }
        std::vector<int,std::allocator<int>>::assign<int_const*,void>
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (int *)CONCAT44(in_stack_fffffffffffff7ac,
                                   CONCAT13(in_stack_fffffffffffff7ab,
                                            CONCAT12(in_stack_fffffffffffff7aa,
                                                     in_stack_fffffffffffff7a8))),
                   (int *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff7ac,
                            CONCAT13(in_stack_fffffffffffff7ab,
                                     CONCAT12(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a8)))
                   ,(double *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
      }
      if (bVar2 && bVar6) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
        in_stack_fffffffffffff7b0 = local_1c;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &(this_00->basis_).debug_origin_name.field_2,(long)local_18);
        *pvVar4 = in_stack_fffffffffffff7b0;
        *(undefined4 *)&(this_00->basis_).debug_origin_name = 2;
      }
      else {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
        in_stack_fffffffffffff7ac = local_1c;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &(this_00->basis_).debug_origin_name.field_2,(long)local_14);
        *pvVar4 = in_stack_fffffffffffff7ac;
        *(undefined4 *)&(this_00->basis_).debug_origin_name = 1;
      }
      if (in_stack_00000010 == -1) {
        *(undefined4 *)&(this_00->icrash_info_).starting_weight = 0xffffffff;
      }
      else {
        *(undefined4 *)&(this_00->icrash_info_).starting_weight = 1;
      }
      (this_00->icrash_info_).final_weight = (double)local_30;
      if ((0 < local_14) && (in_stack_00000070 != 0)) {
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
                  (in_RDI,(size_type)__new_size);
        for (local_438 = 0; (int)local_438 < local_14; local_438 = local_438 + 1) {
          uVar1 = *(uint *)(in_stack_00000070 + (long)(int)local_438 * 4);
          in_stack_fffffffffffff7ab = true;
          if (((uVar1 != 0) && (in_stack_fffffffffffff7ab = true, uVar1 != 1)) &&
             (in_stack_fffffffffffff7ab = true, uVar1 != 2)) {
            in_stack_fffffffffffff7ab = uVar1 == 3;
          }
          if ((bool)in_stack_fffffffffffff7ab == false) {
            highsLogDev((HighsLogOptions *)(in_RDI + 0x97),kError,
                        "Model has illegal integer value of %d for integrality[%d]\n",(ulong)uVar1,
                        (ulong)local_438);
            local_4 = kError;
            goto LAB_00485ff4;
          }
          in_stack_fffffffffffff7aa = (value_type)uVar1;
          pvVar5 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              &(this_00->model_).lp_.col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish,(long)(int)local_438);
          *pvVar5 = in_stack_fffffffffffff7aa;
        }
      }
      if (0 < local_20) {
        std::vector<int,std::allocator<int>>::assign<int_const*,void>
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (int *)CONCAT44(in_stack_fffffffffffff7ac,
                                   CONCAT13(in_stack_fffffffffffff7ab,
                                            CONCAT12(in_stack_fffffffffffff7aa,
                                                     in_stack_fffffffffffff7a8))),
                   (int *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff88,
                            (long)local_14);
        *pvVar4 = local_20;
        std::vector<int,std::allocator<int>>::assign<int_const*,void>
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (int *)CONCAT44(in_stack_fffffffffffff7ac,
                                   CONCAT13(in_stack_fffffffffffff7ab,
                                            CONCAT12(in_stack_fffffffffffff7aa,
                                                     in_stack_fffffffffffff7a8))),
                   (int *)CONCAT44(local_20,in_stack_fffffffffffff7a0));
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar3,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0))),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff7ac,
                            CONCAT13(in_stack_fffffffffffff7ab,
                                     CONCAT12(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a8)))
                   ,(double *)CONCAT44(local_20,in_stack_fffffffffffff7a0));
        in_stack_fffffffffffff7a4 = local_20;
      }
      HighsModel::HighsModel
                ((HighsModel *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                 (HighsModel *)&stack0xfffffffffffff7d0);
      in_stack_fffffffffffff7a0 = passModel(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      local_4 = in_stack_fffffffffffff7a0;
      HighsModel::~HighsModel
                ((HighsModel *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
    }
    else {
      highsLogUser((HighsLogOptions *)(in_RDI + 0x97),kError,
                   "Model has illegal Hessian matrix format\n");
      local_4 = kError;
    }
  }
  else {
    highsLogUser((HighsLogOptions *)(in_RDI + 0x97),kError,
                 "Model has illegal constraint matrix format\n");
    local_4 = kError;
  }
LAB_00485ff4:
  HighsModel::~HighsModel
            ((HighsModel *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
  return local_4;
}

Assistant:

HighsStatus Highs::passModel(
    const HighsInt num_col, const HighsInt num_row, const HighsInt a_num_nz,
    const HighsInt q_num_nz, const HighsInt a_format, const HighsInt q_format,
    const HighsInt sense, const double offset, const double* costs,
    const double* col_lower, const double* col_upper, const double* row_lower,
    const double* row_upper, const HighsInt* a_start, const HighsInt* a_index,
    const double* a_value, const HighsInt* q_start, const HighsInt* q_index,
    const double* q_value, const HighsInt* integrality) {
  this->logHeader();
  HighsModel model;
  HighsLp& lp = model.lp_;
  // Check that the formats of the constraint matrix and Hessian are valid
  if (!aFormatOk(a_num_nz, a_format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal constraint matrix format\n");
    return HighsStatus::kError;
  }
  if (!qFormatOk(q_num_nz, q_format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal Hessian matrix format\n");
    return HighsStatus::kError;
  }
  const bool a_rowwise =
      a_num_nz > 0 ? a_format == (HighsInt)MatrixFormat::kRowwise : false;
  //  if (num_nz) a_rowwise = a_format == (HighsInt)MatrixFormat::kRowwise;

  lp.num_col_ = num_col;
  lp.num_row_ = num_row;
  if (num_col > 0) {
    assert(costs != NULL);
    assert(col_lower != NULL);
    assert(col_upper != NULL);
    lp.col_cost_.assign(costs, costs + num_col);
    lp.col_lower_.assign(col_lower, col_lower + num_col);
    lp.col_upper_.assign(col_upper, col_upper + num_col);
  }
  if (num_row > 0) {
    assert(row_lower != NULL);
    assert(row_upper != NULL);
    lp.row_lower_.assign(row_lower, row_lower + num_row);
    lp.row_upper_.assign(row_upper, row_upper + num_row);
  }
  if (a_num_nz > 0) {
    assert(num_col > 0);
    assert(num_row > 0);
    assert(a_start != NULL);
    assert(a_index != NULL);
    assert(a_value != NULL);
    if (a_rowwise) {
      lp.a_matrix_.start_.assign(a_start, a_start + num_row);
    } else {
      lp.a_matrix_.start_.assign(a_start, a_start + num_col);
    }
    lp.a_matrix_.index_.assign(a_index, a_index + a_num_nz);
    lp.a_matrix_.value_.assign(a_value, a_value + a_num_nz);
  }
  if (a_rowwise) {
    lp.a_matrix_.start_.resize(num_row + 1);
    lp.a_matrix_.start_[num_row] = a_num_nz;
    lp.a_matrix_.format_ = MatrixFormat::kRowwise;
  } else {
    lp.a_matrix_.start_.resize(num_col + 1);
    lp.a_matrix_.start_[num_col] = a_num_nz;
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
  }
  if (sense == (HighsInt)ObjSense::kMaximize) {
    lp.sense_ = ObjSense::kMaximize;
  } else {
    lp.sense_ = ObjSense::kMinimize;
  }
  lp.offset_ = offset;
  if (num_col > 0 && integrality != NULL) {
    lp.integrality_.resize(num_col);
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      HighsInt integrality_status = integrality[iCol];
      const bool legal_integrality_status =
          integrality_status == (HighsInt)HighsVarType::kContinuous ||
          integrality_status == (HighsInt)HighsVarType::kInteger ||
          integrality_status == (HighsInt)HighsVarType::kSemiContinuous ||
          integrality_status == (HighsInt)HighsVarType::kSemiInteger;
      if (!legal_integrality_status) {
        highsLogDev(
            options_.log_options, HighsLogType::kError,
            "Model has illegal integer value of %d for integrality[%d]\n",
            (int)integrality_status, iCol);
        return HighsStatus::kError;
      }
      lp.integrality_[iCol] = (HighsVarType)integrality_status;
    }
  }
  if (q_num_nz > 0) {
    assert(num_col > 0);
    assert(q_start != NULL);
    assert(q_index != NULL);
    assert(q_value != NULL);
    HighsHessian& hessian = model.hessian_;
    hessian.dim_ = num_col;
    hessian.format_ = HessianFormat::kTriangular;
    hessian.start_.assign(q_start, q_start + num_col);
    hessian.start_.resize(num_col + 1);
    hessian.start_[num_col] = q_num_nz;
    hessian.index_.assign(q_index, q_index + q_num_nz);
    hessian.value_.assign(q_value, q_value + q_num_nz);
  }
  return passModel(std::move(model));
}